

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall
ON_BinaryArchive::Internal_WriteObject(ON_BinaryArchive *this,ON_Object *model_object)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ON_UUID object_class_id;
  ON_UUID local_40;
  
  iVar3 = (**model_object->_vptr_ON_Object)(model_object);
  if ((ON_ClassId *)CONCAT44(extraout_var,iVar3) == (ON_ClassId *)0x0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x127d,"","archive_object->ClassId() is nullptr.");
    return false;
  }
  bVar1 = BeginWrite3dmBigChunk(this,0x27ffa,0);
  if (!bVar1) {
    return false;
  }
  bVar2 = false;
  bVar1 = BeginWrite3dmBigChunk(this,0x2fffb,0);
  if (!bVar1) goto LAB_003c969b;
  local_40 = ON_ClassId::Uuid((ON_ClassId *)CONCAT44(extraout_var,iVar3));
  bVar1 = WriteUuid(this,&local_40);
  bVar2 = EndWrite3dmChunk(this);
  if (bVar2 && bVar1) {
    bVar2 = false;
    bVar1 = BeginWrite3dmBigChunk(this,0x2fffc,0);
    if (!bVar1) goto LAB_003c969b;
    iVar3 = (*model_object->_vptr_ON_Object[10])(model_object,this);
    if ((byte)iVar3 == 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x1297,"","archive_object->Write() failed.");
    }
    bVar1 = EndWrite3dmChunk(this);
    if ((((byte)iVar3 & bVar1) == 1) &&
       ((bVar1 = ObjectHasUserDataToWrite(this,model_object), !bVar1 ||
        (bVar1 = WriteObjectUserData(this,model_object), bVar1)))) {
      bVar2 = false;
      bVar1 = BeginWrite3dmBigChunk(this,0x80027fff,0);
      if (bVar1) {
        bVar2 = EndWrite3dmChunk(this);
      }
      goto LAB_003c969b;
    }
  }
  bVar2 = false;
LAB_003c969b:
  bVar1 = EndWrite3dmChunk(this);
  return (bool)(bVar1 & bVar2);
}

Assistant:

bool ON_BinaryArchive::Internal_WriteObject(
  const ON_Object& model_object
)
{
  const ON_ClassId* pID = model_object.ClassId();
  if ( nullptr == pID )
  {
    ON_ERROR("archive_object->ClassId() is nullptr.");
    return false;
  }
    
  if (false == BeginWrite3dmChunk(TCODE_OPENNURBS_CLASS, 0))
    return false;

  bool rc = false;
  for (;;)
  {
    // TCODE_OPENNURBS_CLASS_UUID chunk contains class's UUID 
    if (false == BeginWrite3dmChunk(TCODE_OPENNURBS_CLASS_UUID, 0))
      break;
    const ON_UUID object_class_id = pID->Uuid();
    bool bChunkIdOk = WriteUuid(object_class_id);
    if (false == EndWrite3dmChunk()) // end of TCODE_OPENNURBS_CLASS_UUID chunk
      bChunkIdOk = false;
    if (false == bChunkIdOk)
      break;

    // TCODE_OPENNURBS_CLASS_DATA chunk contains definition of class
    if (false == BeginWrite3dmChunk(TCODE_OPENNURBS_CLASS_DATA, 0))
      break;
    bool bChunkDataOk = model_object.Write(*this) ? true : false;
    if (false == bChunkDataOk)
    {
      ON_ERROR("archive_object->Write() failed.");
    }
    if (false == EndWrite3dmChunk()) // end of TCODE_OPENNURBS_CLASS_DATA chunk
      bChunkDataOk = false;
    if (false == bChunkDataOk)
      break;

    if ( ObjectHasUserDataToWrite(&model_object) )
    {
      // write user data.  Each piece of user data is in a 
      // TCODE_OPENNURBS_CLASS_USERDATA chunk.
      if (false == WriteObjectUserData(model_object))
        break;
    }

    // TCODE_OPENNURBS_CLASS_END chunk marks end of class record
    if (false == BeginWrite3dmChunk(TCODE_OPENNURBS_CLASS_END, 0))
      break;
    if (false == EndWrite3dmChunk())
      break;

    rc = true;
    break;
  }

  if (false == EndWrite3dmChunk()) // end of TCODE_OPENNURBS_CLASS chunk
    rc = false;

  return rc;
}